

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

int32_t mpack_node_i32(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_node_data_t *pmVar2;
  mpack_node_t node_local;
  
  pmVar2 = node.data;
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if (pmVar2->type == mpack_type_uint) {
      if ((pmVar2->value).u < 0x80000000) {
        return (int32_t)(pmVar2->value).f;
      }
    }
    else if (((pmVar2->type == mpack_type_int) && (-0x80000001 < (pmVar2->value).i)) &&
            ((pmVar2->value).i < 0x80000000)) {
      return (int32_t)(pmVar2->value).f;
    }
    mpack_node_flag_error(node,mpack_error_type);
  }
  return 0;
}

Assistant:

MPACK_INLINE int32_t mpack_node_i32(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        if (node.data->value.u <= INT32_MAX)
            return (int32_t)node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= INT32_MIN && node.data->value.i <= INT32_MAX)
            return (int32_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}